

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix __thiscall maths::Matrix::expHelper(Matrix *this,Matrix *m,int num)

{
  int in_ECX;
  Matrix *in_RDX;
  double **extraout_RDX;
  double **extraout_RDX_00;
  double **extraout_RDX_01;
  undefined8 in_RDI;
  Matrix MVar2;
  Matrix *in_stack_ffffffffffffff78;
  Matrix *in_stack_ffffffffffffff80;
  Matrix *this_00;
  Matrix *in_stack_ffffffffffffffa0;
  Matrix *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  double **ppdVar1;
  
  if (in_ECX == 0) {
    MVar2 = createIdentity((int)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    ppdVar1 = MVar2.p;
  }
  else if (in_ECX == 1) {
    Matrix(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ppdVar1 = extraout_RDX;
  }
  else if (in_ECX % 2 == 0) {
    this_00 = (Matrix *)&stack0xffffffffffffffd0;
    maths::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    expHelper(in_RDX,(Matrix *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
    ;
    ~Matrix(this_00);
    ppdVar1 = extraout_RDX_00;
  }
  else {
    maths::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    expHelper(in_RDX,(Matrix *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc)
    ;
    maths::operator*(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    ~Matrix(in_stack_ffffffffffffff80);
    ~Matrix(in_stack_ffffffffffffff80);
    ppdVar1 = extraout_RDX_01;
  }
  MVar2.p = ppdVar1;
  MVar2._0_8_ = in_RDI;
  return MVar2;
}

Assistant:

Matrix Matrix::expHelper(const Matrix& m, int num)
{
    if (num == 0) {
        return createIdentity(m.rows_);
    } else if (num == 1) {
        return m;
    } else if (num % 2 == 0) {  // num is even
        return expHelper(m * m, num/2);
    } else {                    // num is odd
        return m * expHelper(m * m, (num-1)/2);
    }
}